

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O3

X509_SIG *
PKCS8_encrypt(int pbe_nid,EVP_CIPHER *cipher,char *pass,int passlen,uchar *salt,int saltlen,int iter
             ,PKCS8_PRIV_KEY_INFO *p8)

{
  int iVar1;
  size_t pass_len;
  EVP_PKEY *pkey;
  X509_SIG *a;
  undefined4 in_register_0000008c;
  uint8_t *der;
  size_t der_len;
  size_t local_70;
  uint8_t *ptr;
  CBB cbb;
  
  local_70 = CONCAT44(in_register_0000008c,saltlen);
  if (pass == (char *)0x0 || passlen != -1) {
    pass_len = (size_t)passlen;
  }
  else {
    pass_len = strlen(pass);
  }
  pkey = EVP_PKCS82PKEY(p8);
  if (pkey == (EVP_PKEY *)0x0) {
    return (X509_SIG *)0x0;
  }
  der = (uint8_t *)0x0;
  iVar1 = CBB_init(&cbb,0x80);
  if (((iVar1 == 0) ||
      (iVar1 = PKCS8_marshal_encrypted_private_key
                         (&cbb,pbe_nid,(EVP_CIPHER *)cipher,pass,pass_len,salt,local_70,iter,
                          (EVP_PKEY *)pkey), iVar1 == 0)) ||
     (iVar1 = CBB_finish(&cbb,&der,&der_len), iVar1 == 0)) {
    CBB_cleanup(&cbb);
  }
  else {
    ptr = der;
    a = d2i_X509_SIG((X509_SIG **)0x0,&ptr,der_len);
    if ((a != (X509_SIG *)0x0) && (ptr == der + der_len)) goto LAB_00191af5;
    ERR_put_error(0x13,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0xb4);
    X509_SIG_free(a);
  }
  a = (X509_SIG *)0x0;
LAB_00191af5:
  OPENSSL_free(der);
  EVP_PKEY_free(pkey);
  return a;
}

Assistant:

X509_SIG *PKCS8_encrypt(int pbe_nid, const EVP_CIPHER *cipher, const char *pass,
                        int pass_len_in, const uint8_t *salt, size_t salt_len,
                        int iterations, PKCS8_PRIV_KEY_INFO *p8inf) {
  size_t pass_len;
  if (pass_len_in == -1 && pass != NULL) {
    pass_len = strlen(pass);
  } else {
    pass_len = (size_t)pass_len_in;
  }

  // Parse out the private key.
  EVP_PKEY *pkey = EVP_PKCS82PKEY(p8inf);
  if (pkey == NULL) {
    return NULL;
  }

  X509_SIG *ret = NULL;
  uint8_t *der = NULL;
  const uint8_t *ptr;
  size_t der_len;
  CBB cbb;
  if (!CBB_init(&cbb, 128) ||
      !PKCS8_marshal_encrypted_private_key(&cbb, pbe_nid, cipher, pass,
                                           pass_len, salt, salt_len, iterations,
                                           pkey) ||
      !CBB_finish(&cbb, &der, &der_len)) {
    CBB_cleanup(&cbb);
    goto err;
  }

  // Convert back to legacy ASN.1 objects.
  ptr = der;
  ret = d2i_X509_SIG(NULL, &ptr, der_len);
  if (ret == NULL || ptr != der + der_len) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_INTERNAL_ERROR);
    X509_SIG_free(ret);
    ret = NULL;
  }

err:
  OPENSSL_free(der);
  EVP_PKEY_free(pkey);
  return ret;
}